

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DevKkt.cpp
# Opt level: O3

void presolve::dev_kkt_check::checkDualFeasibility(State *state,KktConditionDetails *details)

{
  double *pdVar1;
  double dVar2;
  pointer pdVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  details->type = kPrimalFeasibility;
  details->max_violation = 0.0;
  details->sum_violation_2 = 0.0;
  details->checked = 0;
  details->violated = 0;
  if (0 < state->numCol) {
    lVar8 = 0;
    do {
      if ((state->flagCol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] != 0) {
        details->checked = details->checked + 1;
        dVar10 = (state->colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        pdVar3 = (state->colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar7 = (int)lVar8;
        if ((-INFINITY < dVar10) || (pdVar3[lVar8] < INFINITY)) {
          dVar9 = (state->colValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          dVar2 = pdVar3[lVar8];
          if ((dVar9 != dVar10) || (dVar2 <= dVar10)) {
            if (((dVar9 == dVar2) && (dVar10 < dVar2)) &&
               (1e-07 < (state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                        _M_impl.super__Vector_impl_data._M_start[lVar8])) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: x[",0x19);
              poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]=",2);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->colValue->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"=u[",3);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
              lVar5 = 5;
              pcVar6 = "], z[";
              goto LAB_003683d8;
            }
          }
          else {
            dVar10 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
            if ((dVar10 < 0.0) && (1e-07 < ABS(dVar10))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: l[",0x19);
              poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]=",2);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->colLower->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4," = x[",5);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]=",2);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->colValue->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              lVar5 = 4;
              pcVar6 = ", z[";
LAB_003683d8:
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar6,lVar5);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]=",2);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->colDual->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              dVar10 = (state->colDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                       .super__Vector_impl_data._M_start[lVar8];
              if (dVar10 != 0.0) {
                details->violated = details->violated + 1;
                dVar9 = ABS(dVar10);
                details->sum_violation_2 = dVar10 * dVar10 + details->sum_violation_2;
                if (details->max_violation <= dVar9 && dVar9 != details->max_violation) {
                  details->max_violation = dVar9;
                }
              }
            }
          }
        }
        else if (1e-07 < ABS((state->colDual->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar8])) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[",0x21);
          poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]=",2);
          poVar4 = std::ostream::_M_insert<double>
                             ((state->colValue->super__Vector_base<double,_std::allocator<double>_>)
                              ._M_impl.super__Vector_impl_data._M_start[lVar8]);
          lVar5 = 0xb;
          pcVar6 = ", u=inf, z[";
          goto LAB_003683d8;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < state->numCol);
  }
  if (0 < state->numRow) {
    lVar8 = 0;
    do {
      if ((state->flagRow->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] != 0) {
        details->checked = details->checked + 1;
        dVar10 = (state->rowValue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar8];
        dVar9 = (state->rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        iVar7 = (int)lVar8;
        if (1e-07 <= ABS(dVar9 - dVar10)) {
LAB_0036867a:
          if ((dVar10 <= dVar9) ||
             (1e-07 <= ABS(dVar10 - (state->rowUpper->
                                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                    super__Vector_impl_data._M_start[lVar8]))) {
            if ((dVar9 < dVar10 + 1e-07) &&
               ((dVar10 < (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>).
                          _M_impl.super__Vector_impl_data._M_start[lVar8] + 1e-07 &&
                (1e-07 < ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar8]))))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
              poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,": L= ",5);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->rowLower->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ax=",5);
              poVar4 = std::ostream::_M_insert<double>(dVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", U=",4);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->rowUpper->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", y=",4);
              poVar4 = std::ostream::_M_insert<double>
                                 ((state->rowDual->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[lVar8]);
              std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              dVar10 = ABS((state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar8]);
              goto LAB_0036892f;
            }
          }
          else if (1e-07 < (state->rowDual->super__Vector_base<double,_std::allocator<double>_>).
                           _M_impl.super__Vector_impl_data._M_start[lVar8]) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": L= ",5);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ax=",5);
            poVar4 = std::ostream::_M_insert<double>(dVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", U=",4);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", y=",4);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar8]);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            dVar10 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar8];
LAB_0036892f:
            if (0.0 < dVar10) {
              details->violated = details->violated + 1;
              details->sum_violation_2 = dVar10 * dVar10 + details->sum_violation_2;
              if (details->max_violation <= dVar10 && dVar10 != details->max_violation) {
                details->max_violation = dVar10;
              }
            }
          }
        }
        else {
          dVar2 = (state->rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar8];
          if (1e-07 <= ABS(dVar2 - dVar10)) {
            if (dVar2 <= dVar10) goto LAB_0036867a;
            pdVar1 = (state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar8;
            if (-1e-07 < *pdVar1 || *pdVar1 == -1e-07) goto LAB_00368966;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": L= ",5);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowLower->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Ax=",5);
            poVar4 = std::ostream::_M_insert<double>(dVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", U=",4);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowUpper->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[lVar8]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", y=",4);
            poVar4 = std::ostream::_M_insert<double>
                               ((state->rowDual->super__Vector_base<double,_std::allocator<double>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar8]);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            dVar10 = -(state->rowDual->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar8];
            goto LAB_0036892f;
          }
        }
      }
LAB_00368966:
      lVar8 = lVar8 + 1;
    } while (lVar8 < state->numRow);
  }
  if (details->violated == 0) {
    pcVar6 = "Dual feasible.\n";
    lVar8 = 0xf;
  }
  else {
    pcVar6 = "KKT check error: Dual feasibility fail.\n";
    lVar8 = 0x28;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar8);
  return;
}

Assistant:

void checkDualFeasibility(const State& state, KktConditionDetails& details) {
  details.type = KktCondition::kPrimalFeasibility;
  details.checked = 0;
  details.violated = 0;
  details.max_violation = 0.0;
  details.sum_violation_2 = 0.0;

  // check values of z_j are dual feasible
  for (int i = 0; i < state.numCol; i++) {
    if (state.flagCol[i]) {
      details.checked++;
      double infeas = 0;
      // j not in L or U
      if (state.colLower[i] <= -kHighsInf && state.colUpper[i] >= kHighsInf) {
        if (fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l=-inf, x[" << i
                      << "]=" << state.colValue[i] << ", u=inf, z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in L: x=l and l<u
      else if (state.colValue[i] == state.colLower[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] < 0 && fabs(state.colDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: l[" << i
                      << "]=" << state.colLower[i] << " = x[" << i
                      << "]=" << state.colValue[i] << ", z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }
      // j in U: x=u and l<u
      else if (state.colValue[i] == state.colUpper[i] &&
               state.colLower[i] < state.colUpper[i]) {
        if (state.colDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail: x[" << i
                      << "]=" << state.colValue[i] << "=u[" << i << "], z[" << i
                      << "]=" << state.colDual[i] << std::endl;
          infeas = fabs(state.colDual[i]);
        }
      }

      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  // check values of y_i are dual feasible
  for (int i = 0; i < state.numRow; i++) {
    if (state.flagRow[i]) {
      details.checked++;

      double rowV = state.rowValue[i];

      // L = Ax = U can be any sign
      if (fabs(state.rowLower[i] - rowV) < tol &&
          fabs(state.rowUpper[i] - rowV) < tol)
        continue;

      double infeas = 0;
      // L = Ax < U
      if (fabs(state.rowLower[i] - rowV) < tol && rowV < state.rowUpper[i]) {
        if (state.rowDual[i] < -tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = -state.rowDual[i];
        }
      }
      // L < Ax = U
      else if (state.rowLower[i] < rowV &&
               fabs(rowV - state.rowUpper[i]) < tol) {
        if (state.rowDual[i] > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = state.rowDual[i];
        }
      }
      // L < Ax < U
      else if ((state.rowLower[i] < (rowV + tol)) &&
               (rowV < (state.rowUpper[i] + tol))) {
        if (fabs(state.rowDual[i]) > tol) {
          if (dev_print == 1)
            std::cout << "Dual feasibility fail for row " << i
                      << ": L= " << state.rowLower[i] << ", Ax=" << rowV
                      << ", U=" << state.rowUpper[i]
                      << ", y=" << state.rowDual[i] << std::endl;
          infeas = std::abs(state.rowDual[i]);
        }
      }
      if (infeas > 0) {
        details.violated++;
        details.sum_violation_2 += infeas * infeas;

        if (details.max_violation < infeas) details.max_violation = infeas;
      }
    }
  }

  if (details.violated == 0) {
    if (dev_print == 1) std::cout << "Dual feasible.\n";
  } else {
    if (dev_print == 1)
      std::cout << "KKT check error: Dual feasibility fail.\n";
  }
}